

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_open.c
# Opt level: O0

TIFF * TIFFClientOpenExt(char *name,char *mode,thandle_t clientdata,TIFFReadWriteProc readproc,
                        TIFFReadWriteProc writeproc,TIFFSeekProc seekproc,TIFFCloseProc closeproc,
                        TIFFSizeProc sizeproc,TIFFMapFileProc mapproc,TIFFUnmapFileProc unmapproc,
                        TIFFOpenOptions *opts)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  tmsize_t tVar4;
  ulong uVar5;
  TIFFUnmapFileProc local_80;
  TIFFMapFileProc local_78;
  toff_t local_70;
  toff_t n_1;
  tmsize_t size_to_alloc;
  char *pcStack_58;
  anon_union_2_2_c957ebb0 n;
  char *cp;
  TIFF *pTStack_48;
  int m;
  TIFF *tif;
  TIFFSeekProc seekproc_local;
  TIFFReadWriteProc writeproc_local;
  TIFFReadWriteProc readproc_local;
  thandle_t clientdata_local;
  char *mode_local;
  char *name_local;
  
  size_to_alloc._6_2_ = 1;
  tif = (TIFF *)seekproc;
  seekproc_local = (TIFFSeekProc)writeproc;
  writeproc_local = readproc;
  readproc_local = (TIFFReadWriteProc)clientdata;
  clientdata_local = mode;
  mode_local = name;
  cp._4_4_ = _TIFFgetMode(opts,clientdata,mode,"TIFFClientOpenExt");
  if (cp._4_4_ == 0xffffffff) {
    return (TIFF *)0x0;
  }
  sVar3 = strlen(mode_local);
  n_1 = sVar3 + 0x4f9;
  if (((opts != (TIFFOpenOptions *)0x0) && (0 < opts->max_single_mem_alloc)) &&
     (opts->max_single_mem_alloc < (long)n_1)) {
    _TIFFErrorEarly(opts,readproc_local,"TIFFClientOpenExt",
                    "%s: Memory allocation of %lu bytes is beyond the %lu byte limit defined in open options"
                    ,mode_local,n_1,opts->max_single_mem_alloc);
    return (TIFF *)0x0;
  }
  pTStack_48 = (TIFF *)_TIFFmallocExt((TIFF *)0x0,n_1);
  if (pTStack_48 == (TIFF *)0x0) {
    _TIFFErrorEarly(opts,readproc_local,"TIFFClientOpenExt","%s: Out of memory (TIFF structure)",
                    mode_local);
    return (TIFF *)0x0;
  }
  _TIFFmemset(pTStack_48,0,0x4f8);
  pTStack_48->tif_name = (char *)(pTStack_48 + 1);
  strcpy(pTStack_48->tif_name,mode_local);
  pTStack_48->tif_mode = cp._4_4_ & 0xfffffdbf;
  pTStack_48->tif_curdir = 0xffffffff;
  pTStack_48->tif_curoff = 0;
  pTStack_48->tif_curstrip = 0xffffffff;
  pTStack_48->tif_row = 0xffffffff;
  pTStack_48->tif_clientdata = readproc_local;
  pTStack_48->tif_readproc = writeproc_local;
  pTStack_48->tif_writeproc = (TIFFReadWriteProc)seekproc_local;
  pTStack_48->tif_seekproc = (TIFFSeekProc)tif;
  pTStack_48->tif_closeproc = closeproc;
  pTStack_48->tif_sizeproc = sizeproc;
  if (mapproc == (TIFFMapFileProc)0x0) {
    local_78 = _tiffDummyMapProc;
  }
  else {
    local_78 = mapproc;
  }
  pTStack_48->tif_mapproc = local_78;
  if (unmapproc == (TIFFUnmapFileProc)0x0) {
    local_80 = _tiffDummyUnmapProc;
  }
  else {
    local_80 = unmapproc;
  }
  pTStack_48->tif_unmapproc = local_80;
  if (opts != (TIFFOpenOptions *)0x0) {
    pTStack_48->tif_errorhandler = opts->errorhandler;
    pTStack_48->tif_errorhandler_user_data = opts->errorhandler_user_data;
    pTStack_48->tif_warnhandler = opts->warnhandler;
    pTStack_48->tif_warnhandler_user_data = opts->warnhandler_user_data;
    pTStack_48->tif_max_single_mem_alloc = opts->max_single_mem_alloc;
  }
  if (((writeproc_local == (TIFFReadWriteProc)0x0) || (seekproc_local == (TIFFSeekProc)0x0)) ||
     ((tif == (TIFF *)0x0 || ((closeproc == (TIFFCloseProc)0x0 || (sizeproc == (TIFFSizeProc)0x0))))
     )) {
    TIFFErrorExtR(pTStack_48,"TIFFClientOpenExt","One of the client procedures is NULL pointer.");
    _TIFFfreeExt((TIFF *)0x0,pTStack_48);
    return (TIFF *)0x0;
  }
  _TIFFSetDefaultCompressionState(pTStack_48);
  pTStack_48->tif_flags = 1;
  if (cp._4_4_ == 0) {
    pTStack_48->tif_flags = pTStack_48->tif_flags | 0x800;
LAB_003eaeb2:
    pTStack_48->tif_flags = pTStack_48->tif_flags | 0x8000;
  }
  else if (cp._4_4_ == 2) goto LAB_003eaeb2;
  for (pcStack_58 = (char *)clientdata_local; *pcStack_58 != '\0'; pcStack_58 = pcStack_58 + 1) {
    switch(*pcStack_58) {
    case '8':
      if ((cp._4_4_ & 0x40) != 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x80000;
      }
      break;
    case 'B':
      pTStack_48->tif_flags = pTStack_48->tif_flags & 0xfffffffc | 1;
      break;
    case 'C':
      if (cp._4_4_ == 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x8000;
      }
      break;
    case 'D':
      pTStack_48->tif_flags = pTStack_48->tif_flags | 0x1000000;
      break;
    case 'H':
      TIFFWarningExtR(pTStack_48,mode_local,
                      "H(ost) mode is deprecated. Since libtiff 4.5.1, it is an alias of \'B\' / FILLORDER_MSB2LSB."
                     );
      pTStack_48->tif_flags = pTStack_48->tif_flags & 0xfffffffc | 1;
      break;
    case 'L':
      pTStack_48->tif_flags = pTStack_48->tif_flags & 0xfffffffc | 2;
      break;
    case 'M':
      if (cp._4_4_ == 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x800;
      }
      break;
    case 'O':
      if (cp._4_4_ == 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x3000000;
      }
      break;
    case 'b':
      if ((cp._4_4_ & 0x40) != 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x80;
      }
      break;
    case 'c':
      if (cp._4_4_ == 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags & 0xffff7fff;
      }
      break;
    case 'h':
      pTStack_48->tif_flags = pTStack_48->tif_flags | 0x10000;
      break;
    case 'l':
      break;
    case 'm':
      if (cp._4_4_ == 0) {
        pTStack_48->tif_flags = pTStack_48->tif_flags & 0xfffff7ff;
      }
    }
  }
  if (((cp._4_4_ & 0x200) == 0) &&
     (tVar4 = (*pTStack_48->tif_readproc)(pTStack_48->tif_clientdata,&pTStack_48->tif_header,8),
     tVar4 == 8)) {
    if (((pTStack_48->tif_header).common.tiff_magic == 0x4d4d) ||
       ((pTStack_48->tif_header).common.tiff_magic == 0x4949)) {
      if ((pTStack_48->tif_header).common.tiff_magic == 0x4d4d) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x80;
      }
      if ((pTStack_48->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&(pTStack_48->tif_header).common.tiff_version);
      }
      if (((pTStack_48->tif_header).common.tiff_version == 0x2a) ||
         ((pTStack_48->tif_header).common.tiff_version == 0x2b)) {
        if ((pTStack_48->tif_header).common.tiff_version == 0x2a) {
          if ((pTStack_48->tif_flags & 0x80) != 0) {
            TIFFSwabLong(&(pTStack_48->tif_header).classic.tiff_diroff);
          }
          pTStack_48->tif_header_size = 8;
        }
        else {
          tVar4 = (*pTStack_48->tif_readproc)
                            (pTStack_48->tif_clientdata,(void *)((long)&pTStack_48->tif_header + 8),
                             8);
          if (tVar4 != 8) {
            TIFFErrorExtR(pTStack_48,mode_local,"Cannot read TIFF header");
            goto LAB_003eb6af;
          }
          if ((pTStack_48->tif_flags & 0x80) != 0) {
            TIFFSwabShort(&(pTStack_48->tif_header).big.tiff_offsetsize);
            TIFFSwabLong8(&(pTStack_48->tif_header).big.tiff_diroff);
          }
          if ((pTStack_48->tif_header).big.tiff_offsetsize != 8) {
            TIFFErrorExtR(pTStack_48,mode_local,"Not a TIFF file, bad BigTIFF offsetsize %u (0x%x)",
                          (ulong)(pTStack_48->tif_header).big.tiff_offsetsize,
                          (ulong)(pTStack_48->tif_header).big.tiff_offsetsize);
            goto LAB_003eb6af;
          }
          if ((pTStack_48->tif_header).big.tiff_unused != 0) {
            TIFFErrorExtR(pTStack_48,mode_local,"Not a TIFF file, bad BigTIFF unused %u (0x%x)",
                          (ulong)(pTStack_48->tif_header).big.tiff_unused,
                          (ulong)(pTStack_48->tif_header).big.tiff_unused);
            goto LAB_003eb6af;
          }
          pTStack_48->tif_header_size = 0x10;
          pTStack_48->tif_flags = pTStack_48->tif_flags | 0x80000;
        }
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x200;
        pTStack_48->tif_rawdata = (uint8_t *)0x0;
        pTStack_48->tif_rawcp = (uint8_t *)0x0;
        pTStack_48->tif_rawdatasize = 0;
        pTStack_48->tif_rawdataoff = 0;
        pTStack_48->tif_rawdataloaded = 0;
        if (*clientdata_local == 'a') {
          iVar2 = TIFFDefaultDirectory(pTStack_48);
          if (iVar2 != 0) {
            return pTStack_48;
          }
        }
        else if (*clientdata_local == 'r') {
          if ((pTStack_48->tif_flags & 0x80000) == 0) {
            pTStack_48->tif_nextdiroff = (ulong)(pTStack_48->tif_header).classic.tiff_diroff;
          }
          else {
            pTStack_48->tif_nextdiroff = (pTStack_48->tif_header).big.tiff_diroff;
          }
          if ((pTStack_48->tif_flags & 0x800) != 0) {
            iVar2 = (*pTStack_48->tif_mapproc)
                              (pTStack_48->tif_clientdata,&pTStack_48->tif_base,&local_70);
            if (iVar2 == 0) {
              pTStack_48->tif_flags = pTStack_48->tif_flags & 0xfffff7ff;
            }
            else {
              pTStack_48->tif_size = local_70;
              if (pTStack_48->tif_size != local_70) {
                __assert_fail("(toff_t)tif->tif_size == n",
                              "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_open.c"
                              ,0x264,
                              "TIFF *TIFFClientOpenExt(const char *, const char *, thandle_t, TIFFReadWriteProc, TIFFReadWriteProc, TIFFSeekProc, TIFFCloseProc, TIFFSizeProc, TIFFMapFileProc, TIFFUnmapFileProc, TIFFOpenOptions *)"
                             );
              }
            }
          }
          if ((pTStack_48->tif_flags & 0x10000) != 0) {
            return pTStack_48;
          }
          iVar2 = TIFFReadDirectory(pTStack_48);
          if (iVar2 != 0) {
            return pTStack_48;
          }
        }
      }
      else {
        TIFFErrorExtR(pTStack_48,mode_local,"Not a TIFF file, bad version number %u (0x%x)",
                      (ulong)(pTStack_48->tif_header).common.tiff_version,
                      (ulong)(pTStack_48->tif_header).common.tiff_version);
      }
    }
    else {
      TIFFErrorExtR(pTStack_48,mode_local,"Not a TIFF file, bad magic number %u (0x%x)",
                    (ulong)(pTStack_48->tif_header).common.tiff_magic,
                    (ulong)(pTStack_48->tif_header).common.tiff_magic);
    }
  }
  else if (pTStack_48->tif_mode == 0) {
    TIFFErrorExtR(pTStack_48,mode_local,"Cannot read TIFF header");
  }
  else {
    uVar1 = 0x4949;
    if ((pTStack_48->tif_flags & 0x80) != 0) {
      uVar1 = 0x4d4d;
    }
    (pTStack_48->tif_header).common.tiff_magic = uVar1;
    if ((pTStack_48->tif_flags & 0x80000) == 0) {
      (pTStack_48->tif_header).common.tiff_version = 0x2a;
      (pTStack_48->tif_header).classic.tiff_diroff = 0;
      if ((pTStack_48->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&(pTStack_48->tif_header).common.tiff_version);
      }
      pTStack_48->tif_header_size = 8;
    }
    else {
      (pTStack_48->tif_header).common.tiff_version = 0x2b;
      (pTStack_48->tif_header).big.tiff_offsetsize = 8;
      (pTStack_48->tif_header).big.tiff_unused = 0;
      (pTStack_48->tif_header).big.tiff_diroff = 0;
      if ((pTStack_48->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&(pTStack_48->tif_header).common.tiff_version);
        TIFFSwabShort(&(pTStack_48->tif_header).big.tiff_offsetsize);
      }
      pTStack_48->tif_header_size = 0x10;
    }
    (*pTStack_48->tif_seekproc)(pTStack_48->tif_clientdata,0,0);
    uVar5 = (*pTStack_48->tif_writeproc)
                      (pTStack_48->tif_clientdata,&pTStack_48->tif_header,
                       (tmsize_t)pTStack_48->tif_header_size);
    if (uVar5 == pTStack_48->tif_header_size) {
      if ((pTStack_48->tif_header).common.tiff_magic == 0x4d4d) {
        pTStack_48->tif_flags = pTStack_48->tif_flags | 0x80;
      }
      iVar2 = TIFFDefaultDirectory(pTStack_48);
      if (iVar2 != 0) {
        pTStack_48->tif_diroff = 0;
        pTStack_48->tif_lastdiroff = 0;
        pTStack_48->tif_setdirectory_force_absolute = 0;
        return pTStack_48;
      }
    }
    else {
      TIFFErrorExtR(pTStack_48,mode_local,"Error writing TIFF header");
    }
  }
LAB_003eb6af:
  pTStack_48->tif_mode = 0;
  TIFFCleanup(pTStack_48);
  return (TIFF *)0x0;
}

Assistant:

TIFF *TIFFClientOpenExt(const char *name, const char *mode,
                        thandle_t clientdata, TIFFReadWriteProc readproc,
                        TIFFReadWriteProc writeproc, TIFFSeekProc seekproc,
                        TIFFCloseProc closeproc, TIFFSizeProc sizeproc,
                        TIFFMapFileProc mapproc, TIFFUnmapFileProc unmapproc,
                        TIFFOpenOptions *opts)
{
    static const char module[] = "TIFFClientOpenExt";
    TIFF *tif;
    int m;
    const char *cp;

    /* The following are configuration checks. They should be redundant, but
     * should not compile to any actual code in an optimised release build
     * anyway. If any of them fail, (makefile-based or other) configuration is
     * not correct */
    assert(sizeof(uint8_t) == 1);
    assert(sizeof(int8_t) == 1);
    assert(sizeof(uint16_t) == 2);
    assert(sizeof(int16_t) == 2);
    assert(sizeof(uint32_t) == 4);
    assert(sizeof(int32_t) == 4);
    assert(sizeof(uint64_t) == 8);
    assert(sizeof(int64_t) == 8);
    {
        union
        {
            uint8_t a8[2];
            uint16_t a16;
        } n;
        n.a8[0] = 1;
        n.a8[1] = 0;
        (void)n;
#ifdef WORDS_BIGENDIAN
        assert(n.a16 == 256);
#else
        assert(n.a16 == 1);
#endif
    }

    m = _TIFFgetMode(opts, clientdata, mode, module);
    if (m == -1)
        goto bad2;
    tmsize_t size_to_alloc = (tmsize_t)(sizeof(TIFF) + strlen(name) + 1);
    if (opts && opts->max_single_mem_alloc > 0 &&
        size_to_alloc > opts->max_single_mem_alloc)
    {
        _TIFFErrorEarly(opts, clientdata, module,
                        "%s: Memory allocation of %" PRIu64
                        " bytes is beyond the %" PRIu64
                        " byte limit defined in open options",
                        name, (uint64_t)size_to_alloc,
                        (uint64_t)opts->max_single_mem_alloc);
        goto bad2;
    }
    tif = (TIFF *)_TIFFmallocExt(NULL, size_to_alloc);
    if (tif == NULL)
    {
        _TIFFErrorEarly(opts, clientdata, module,
                        "%s: Out of memory (TIFF structure)", name);
        goto bad2;
    }
    _TIFFmemset(tif, 0, sizeof(*tif));
    tif->tif_name = (char *)tif + sizeof(TIFF);
    strcpy(tif->tif_name, name);
    tif->tif_mode = m & ~(O_CREAT | O_TRUNC);
    tif->tif_curdir = TIFF_NON_EXISTENT_DIR_NUMBER; /* non-existent directory */
    tif->tif_curoff = 0;
    tif->tif_curstrip = (uint32_t)-1; /* invalid strip */
    tif->tif_row = (uint32_t)-1;      /* read/write pre-increment */
    tif->tif_clientdata = clientdata;
    tif->tif_readproc = readproc;
    tif->tif_writeproc = writeproc;
    tif->tif_seekproc = seekproc;
    tif->tif_closeproc = closeproc;
    tif->tif_sizeproc = sizeproc;
    tif->tif_mapproc = mapproc ? mapproc : _tiffDummyMapProc;
    tif->tif_unmapproc = unmapproc ? unmapproc : _tiffDummyUnmapProc;
    if (opts)
    {
        tif->tif_errorhandler = opts->errorhandler;
        tif->tif_errorhandler_user_data = opts->errorhandler_user_data;
        tif->tif_warnhandler = opts->warnhandler;
        tif->tif_warnhandler_user_data = opts->warnhandler_user_data;
        tif->tif_max_single_mem_alloc = opts->max_single_mem_alloc;
    }

    if (!readproc || !writeproc || !seekproc || !closeproc || !sizeproc)
    {
        TIFFErrorExtR(tif, module,
                      "One of the client procedures is NULL pointer.");
        _TIFFfreeExt(NULL, tif);
        goto bad2;
    }

    _TIFFSetDefaultCompressionState(tif); /* setup default state */
    /*
     * Default is to return data MSB2LSB and enable the
     * use of memory-mapped files and strip chopping when
     * a file is opened read-only.
     */
    tif->tif_flags = FILLORDER_MSB2LSB;
    if (m == O_RDONLY)
        tif->tif_flags |= TIFF_MAPPED;

#ifdef STRIPCHOP_DEFAULT
    if (m == O_RDONLY || m == O_RDWR)
        tif->tif_flags |= STRIPCHOP_DEFAULT;
#endif

    /*
     * Process library-specific flags in the open mode string.
     * The following flags may be used to control intrinsic library
     * behavior that may or may not be desirable (usually for
     * compatibility with some application that claims to support
     * TIFF but only supports some brain dead idea of what the
     * vendor thinks TIFF is):
     *
     * 'l' use little-endian byte order for creating a file
     * 'b' use big-endian byte order for creating a file
     * 'L' read/write information using LSB2MSB bit order
     * 'B' read/write information using MSB2LSB bit order
     * 'H' read/write information using host bit order
     * 'M' enable use of memory-mapped files when supported
     * 'm' disable use of memory-mapped files
     * 'C' enable strip chopping support when reading
     * 'c' disable strip chopping support
     * 'h' read TIFF header only, do not load the first IFD
     * '4' ClassicTIFF for creating a file (default)
     * '8' BigTIFF for creating a file
     * 'D' enable use of deferred strip/tile offset/bytecount array loading.
     * 'O' on-demand loading of values instead of whole array loading (implies
     * D)
     *
     * The use of the 'l' and 'b' flags is strongly discouraged.
     * These flags are provided solely because numerous vendors,
     * typically on the PC, do not correctly support TIFF; they
     * only support the Intel little-endian byte order.  This
     * support is not configured by default because it supports
     * the violation of the TIFF spec that says that readers *MUST*
     * support both byte orders.  It is strongly recommended that
     * you not use this feature except to deal with busted apps
     * that write invalid TIFF.  And even in those cases you should
     * bang on the vendors to fix their software.
     *
     * The 'L', 'B', and 'H' flags are intended for applications
     * that can optimize operations on data by using a particular
     * bit order.  By default the library returns data in MSB2LSB
     * bit order for compatibility with older versions of this
     * library.  Returning data in the bit order of the native CPU
     * makes the most sense but also requires applications to check
     * the value of the FillOrder tag; something they probably do
     * not do right now.
     *
     * The 'M' and 'm' flags are provided because some virtual memory
     * systems exhibit poor behavior when large images are mapped.
     * These options permit clients to control the use of memory-mapped
     * files on a per-file basis.
     *
     * The 'C' and 'c' flags are provided because the library support
     * for chopping up large strips into multiple smaller strips is not
     * application-transparent and as such can cause problems.  The 'c'
     * option permits applications that only want to look at the tags,
     * for example, to get the unadulterated TIFF tag information.
     */
    for (cp = mode; *cp; cp++)
        switch (*cp)
        {
            case 'b':
#ifndef WORDS_BIGENDIAN
                if (m & O_CREAT)
                    tif->tif_flags |= TIFF_SWAB;
#endif
                break;
            case 'l':
#ifdef WORDS_BIGENDIAN
                if ((m & O_CREAT))
                    tif->tif_flags |= TIFF_SWAB;
#endif
                break;
            case 'B':
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_MSB2LSB;
                break;
            case 'L':
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_LSB2MSB;
                break;
            case 'H':
                TIFFWarningExtR(tif, name,
                                "H(ost) mode is deprecated. Since "
                                "libtiff 4.5.1, it is an alias of 'B' / "
                                "FILLORDER_MSB2LSB.");
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_MSB2LSB;
                break;
            case 'M':
                if (m == O_RDONLY)
                    tif->tif_flags |= TIFF_MAPPED;
                break;
            case 'm':
                if (m == O_RDONLY)
                    tif->tif_flags &= ~TIFF_MAPPED;
                break;
            case 'C':
                if (m == O_RDONLY)
                    tif->tif_flags |= TIFF_STRIPCHOP;
                break;
            case 'c':
                if (m == O_RDONLY)
                    tif->tif_flags &= ~TIFF_STRIPCHOP;
                break;
            case 'h':
                tif->tif_flags |= TIFF_HEADERONLY;
                break;
            case '8':
                if (m & O_CREAT)
                    tif->tif_flags |= TIFF_BIGTIFF;
                break;
            case 'D':
                tif->tif_flags |= TIFF_DEFERSTRILELOAD;
                break;
            case 'O':
                if (m == O_RDONLY)
                    tif->tif_flags |=
                        (TIFF_LAZYSTRILELOAD | TIFF_DEFERSTRILELOAD);
                break;
        }

#ifdef DEFER_STRILE_LOAD
    /* Compatibility with old DEFER_STRILE_LOAD compilation flag */
    /* Probably unneeded, since to the best of my knowledge (E. Rouault) */
    /* GDAL was the only user of this, and will now use the new 'D' flag */
    tif->tif_flags |= TIFF_DEFERSTRILELOAD;
#endif

    /*
     * Read in TIFF header.
     */
    if ((m & O_TRUNC) ||
        !ReadOK(tif, &tif->tif_header, sizeof(TIFFHeaderClassic)))
    {
        if (tif->tif_mode == O_RDONLY)
        {
            TIFFErrorExtR(tif, name, "Cannot read TIFF header");
            goto bad;
        }
/*
 * Setup header and write.
 */
#ifdef WORDS_BIGENDIAN
        tif->tif_header.common.tiff_magic =
            (tif->tif_flags & TIFF_SWAB) ? TIFF_LITTLEENDIAN : TIFF_BIGENDIAN;
#else
        tif->tif_header.common.tiff_magic =
            (tif->tif_flags & TIFF_SWAB) ? TIFF_BIGENDIAN : TIFF_LITTLEENDIAN;
#endif
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            tif->tif_header.common.tiff_version = TIFF_VERSION_CLASSIC;
            tif->tif_header.classic.tiff_diroff = 0;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&tif->tif_header.common.tiff_version);
            tif->tif_header_size = sizeof(TIFFHeaderClassic);
        }
        else
        {
            tif->tif_header.common.tiff_version = TIFF_VERSION_BIG;
            tif->tif_header.big.tiff_offsetsize = 8;
            tif->tif_header.big.tiff_unused = 0;
            tif->tif_header.big.tiff_diroff = 0;
            if (tif->tif_flags & TIFF_SWAB)
            {
                TIFFSwabShort(&tif->tif_header.common.tiff_version);
                TIFFSwabShort(&tif->tif_header.big.tiff_offsetsize);
            }
            tif->tif_header_size = sizeof(TIFFHeaderBig);
        }
        /*
         * The doc for "fopen" for some STD_C_LIBs says that if you
         * open a file for modify ("+"), then you must fseek (or
         * fflush?) between any freads and fwrites.  This is not
         * necessary on most systems, but has been shown to be needed
         * on Solaris.
         */
        TIFFSeekFile(tif, 0, SEEK_SET);
        if (!WriteOK(tif, &tif->tif_header, (tmsize_t)(tif->tif_header_size)))
        {
            TIFFErrorExtR(tif, name, "Error writing TIFF header");
            goto bad;
        }
        /*
         * Setup the byte order handling.
         */
        if (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN)
        {
#ifndef WORDS_BIGENDIAN
            tif->tif_flags |= TIFF_SWAB;
#endif
        }
        else
        {
#ifdef WORDS_BIGENDIAN
            tif->tif_flags |= TIFF_SWAB;
#endif
        }
        /*
         * Setup default directory.
         */
        if (!TIFFDefaultDirectory(tif))
            goto bad;
        tif->tif_diroff = 0;
        tif->tif_lastdiroff = 0;
        tif->tif_setdirectory_force_absolute = FALSE;
        return (tif);
    }
    /*
     * Setup the byte order handling.
     */
    if (tif->tif_header.common.tiff_magic != TIFF_BIGENDIAN &&
        tif->tif_header.common.tiff_magic != TIFF_LITTLEENDIAN
#if MDI_SUPPORT
        &&
#if HOST_BIGENDIAN
        tif->tif_header.common.tiff_magic != MDI_BIGENDIAN
#else
        tif->tif_header.common.tiff_magic != MDI_LITTLEENDIAN
#endif
    )
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF or MDI file, bad magic number %" PRIu16
                      " (0x%" PRIx16 ")",
#else
    )
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF file, bad magic number %" PRIu16
                      " (0x%" PRIx16 ")",
#endif
                      tif->tif_header.common.tiff_magic,
                      tif->tif_header.common.tiff_magic);
        goto bad;
    }
    if (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN)
    {
#ifndef WORDS_BIGENDIAN
        tif->tif_flags |= TIFF_SWAB;
#endif
    }
    else
    {
#ifdef WORDS_BIGENDIAN
        tif->tif_flags |= TIFF_SWAB;
#endif
    }
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabShort(&tif->tif_header.common.tiff_version);
    if ((tif->tif_header.common.tiff_version != TIFF_VERSION_CLASSIC) &&
        (tif->tif_header.common.tiff_version != TIFF_VERSION_BIG))
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF file, bad version number %" PRIu16
                      " (0x%" PRIx16 ")",
                      tif->tif_header.common.tiff_version,
                      tif->tif_header.common.tiff_version);
        goto bad;
    }
    if (tif->tif_header.common.tiff_version == TIFF_VERSION_CLASSIC)
    {
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&tif->tif_header.classic.tiff_diroff);
        tif->tif_header_size = sizeof(TIFFHeaderClassic);
    }
    else
    {
        if (!ReadOK(tif,
                    ((uint8_t *)(&tif->tif_header) + sizeof(TIFFHeaderClassic)),
                    (sizeof(TIFFHeaderBig) - sizeof(TIFFHeaderClassic))))
        {
            TIFFErrorExtR(tif, name, "Cannot read TIFF header");
            goto bad;
        }
        if (tif->tif_flags & TIFF_SWAB)
        {
            TIFFSwabShort(&tif->tif_header.big.tiff_offsetsize);
            TIFFSwabLong8(&tif->tif_header.big.tiff_diroff);
        }
        if (tif->tif_header.big.tiff_offsetsize != 8)
        {
            TIFFErrorExtR(tif, name,
                          "Not a TIFF file, bad BigTIFF offsetsize %" PRIu16
                          " (0x%" PRIx16 ")",
                          tif->tif_header.big.tiff_offsetsize,
                          tif->tif_header.big.tiff_offsetsize);
            goto bad;
        }
        if (tif->tif_header.big.tiff_unused != 0)
        {
            TIFFErrorExtR(tif, name,
                          "Not a TIFF file, bad BigTIFF unused %" PRIu16
                          " (0x%" PRIx16 ")",
                          tif->tif_header.big.tiff_unused,
                          tif->tif_header.big.tiff_unused);
            goto bad;
        }
        tif->tif_header_size = sizeof(TIFFHeaderBig);
        tif->tif_flags |= TIFF_BIGTIFF;
    }
    tif->tif_flags |= TIFF_MYBUFFER;
    tif->tif_rawcp = tif->tif_rawdata = 0;
    tif->tif_rawdatasize = 0;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = 0;

    switch (mode[0])
    {
        case 'r':
            if (!(tif->tif_flags & TIFF_BIGTIFF))
                tif->tif_nextdiroff = tif->tif_header.classic.tiff_diroff;
            else
                tif->tif_nextdiroff = tif->tif_header.big.tiff_diroff;
            /*
             * Try to use a memory-mapped file if the client
             * has not explicitly suppressed usage with the
             * 'm' flag in the open mode (see above).
             */
            if (tif->tif_flags & TIFF_MAPPED)
            {
                toff_t n;
                if (TIFFMapFileContents(tif, (void **)(&tif->tif_base), &n))
                {
                    tif->tif_size = (tmsize_t)n;
                    assert((toff_t)tif->tif_size == n);
                }
                else
                    tif->tif_flags &= ~TIFF_MAPPED;
            }
            /*
             * Sometimes we do not want to read the first directory (for
             * example, it may be broken) and want to proceed to other
             * directories. I this case we use the TIFF_HEADERONLY flag to open
             * file and return immediately after reading TIFF header.
             */
            if (tif->tif_flags & TIFF_HEADERONLY)
                return (tif);

            /*
             * Setup initial directory.
             */
            if (TIFFReadDirectory(tif))
            {
                return (tif);
            }
            break;
        case 'a':
            /*
             * New directories are automatically append
             * to the end of the directory chain when they
             * are written out (see TIFFWriteDirectory).
             */
            if (!TIFFDefaultDirectory(tif))
                goto bad;
            return (tif);
    }
bad:
    tif->tif_mode = O_RDONLY; /* XXX avoid flush */
    TIFFCleanup(tif);
bad2:
    return ((TIFF *)0);
}

/*
 * Query functions to access private data.
 */

/*
 * Return open file's name.
 */
const char *TIFFFileName(TIFF *tif) { return (tif->tif_name); }

/*
 * Set the file name.
 */
const char *TIFFSetFileName(TIFF *tif, const char *name)
{
    const char *old_name = tif->tif_name;
    tif->tif_name = (char *)name;
    return (old_name);
}

/*
 * Return open file's I/O descriptor.
 */
int TIFFFileno(TIFF *tif) { return (tif->tif_fd); }

/*
 * Set open file's I/O descriptor, and return previous value.
 */
int TIFFSetFileno(TIFF *tif, int fd)
{
    int old_fd = tif->tif_fd;
    tif->tif_fd = fd;
    return old_fd;
}

/*
 * Return open file's clientdata.
 */
thandle_t TIFFClientdata(TIFF *tif) { return (tif->tif_clientdata); }

/*
 * Set open file's clientdata, and return previous value.
 */
thandle_t TIFFSetClientdata(TIFF *tif, thandle_t newvalue)
{
    thandle_t m = tif->tif_clientdata;
    tif->tif_clientdata = newvalue;
    return m;
}

/*
 * Return read/write mode.
 */
int TIFFGetMode(TIFF *tif) { return (tif->tif_mode); }

/*
 * Return read/write mode.
 */
int TIFFSetMode(TIFF *tif, int mode)
{
    int old_mode = tif->tif_mode;
    tif->tif_mode = mode;
    return (old_mode);
}

/*
 * Return nonzero if file is organized in
 * tiles; zero if organized as strips.
 */
int TIFFIsTiled(TIFF *tif) { return (isTiled(tif)); }

/*
 * Return current row being read/written.
 */
uint32_t TIFFCurrentRow(TIFF *tif) { return (tif->tif_row); }

/*
 * Return index of the current directory.
 */
tdir_t TIFFCurrentDirectory(TIFF *tif) { return (tif->tif_curdir); }

/*
 * Return current strip.
 */
uint32_t TIFFCurrentStrip(TIFF *tif) { return (tif->tif_curstrip); }

/*
 * Return current tile.
 */
uint32_t TIFFCurrentTile(TIFF *tif) { return (tif->tif_curtile); }

/*
 * Return nonzero if the file has byte-swapped data.
 */
int TIFFIsByteSwapped(TIFF *tif) { return ((tif->tif_flags & TIFF_SWAB) != 0); }

/*
 * Return nonzero if the data is returned up-sampled.
 */
int TIFFIsUpSampled(TIFF *tif) { return (isUpSampled(tif)); }

/*
 * Return nonzero if the data is returned in MSB-to-LSB bit order.
 */
int TIFFIsMSB2LSB(TIFF *tif) { return (isFillOrder(tif, FILLORDER_MSB2LSB)); }

/*
 * Return nonzero if given file was written in big-endian order.
 */
int TIFFIsBigEndian(TIFF *tif)
{
    return (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN);
}

/*
 * Return nonzero if given file is BigTIFF style.
 */
int TIFFIsBigTIFF(TIFF *tif)
{
    return (tif->tif_header.common.tiff_version == TIFF_VERSION_BIG);
}

/*
 * Return pointer to file read method.
 */
TIFFReadWriteProc TIFFGetReadProc(TIFF *tif) { return (tif->tif_readproc); }

/*
 * Return pointer to file write method.
 */
TIFFReadWriteProc TIFFGetWriteProc(TIFF *tif) { return (tif->tif_writeproc); }

/*
 * Return pointer to file seek method.
 */
TIFFSeekProc TIFFGetSeekProc(TIFF *tif) { return (tif->tif_seekproc); }

/*
 * Return pointer to file close method.
 */
TIFFCloseProc TIFFGetCloseProc(TIFF *tif) { return (tif->tif_closeproc); }

/*
 * Return pointer to file size requesting method.
 */
TIFFSizeProc TIFFGetSizeProc(TIFF *tif) { return (tif->tif_sizeproc); }

/*
 * Return pointer to memory mapping method.
 */
TIFFMapFileProc TIFFGetMapFileProc(TIFF *tif) { return (tif->tif_mapproc); }

/*
 * Return pointer to memory unmapping method.
 */
TIFFUnmapFileProc TIFFGetUnmapFileProc(TIFF *tif)
{
    return (tif->tif_unmapproc);
}